

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

bool __thiscall argo::json::operator<=(json *this,json *other)

{
  type tVar1;
  type tVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  string *psVar6;
  json_exception *this_00;
  char *first_json_type_name;
  char *second_json_type_name;
  double dVar7;
  double dVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  tVar1 = this->m_type;
  tVar2 = other->m_type;
  if (tVar2 == string_e && tVar1 == string_e) {
    psVar6 = operator_cast_to_string_(this);
    std::__cxx11::string::string((string *)&local_60,(string *)psVar6);
    psVar6 = operator_cast_to_string_(other);
    std::__cxx11::string::string((string *)&local_40,(string *)psVar6);
    bVar3 = std::operator<=(&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else if (tVar2 == number_int_e && (tVar1 ^ number_int_e) == object_e) {
    iVar4 = operator_cast_to_int(this);
    iVar5 = operator_cast_to_int(other);
    bVar3 = iVar4 <= iVar5;
  }
  else {
    if (((tVar2 & ~array_e) != number_int_e || tVar1 != number_double_e) &&
       ((tVar1 ^ number_int_e) != object_e || tVar2 != number_double_e)) {
      this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
      first_json_type_name = get_instance_type_name(this);
      second_json_type_name = get_instance_type_name(other);
      json_exception::json_exception
                (this_00,types_not_comparable_e,first_json_type_name,second_json_type_name);
      __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
    }
    dVar7 = operator_cast_to_double(this);
    dVar8 = operator_cast_to_double(other);
    bVar3 = dVar7 <= dVar8;
  }
  return bVar3;
}

Assistant:

bool json::operator<=(const json &other) const
{
    if (m_type == string_e && other.m_type == string_e)
    {
        return static_cast<string>(*this) <= static_cast<string>(other);
    }
    else if (m_type == number_int_e && other.m_type == number_int_e)
    {
        return static_cast<int>(*this) <= static_cast<int>(other);
    }
    else if ((m_type == number_double_e && other.m_type == number_double_e) ||
             (m_type == number_double_e && other.m_type == number_int_e) ||
             (m_type == number_int_e && other.m_type == number_double_e))
    {
        return static_cast<double>(*this) <= static_cast<double>(other);
    }
    else
    {
        throw json_exception(
                        json_exception::types_not_comparable_e,
                        get_instance_type_name(),
                        other.get_instance_type_name());
    }
}